

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O1

int s_mp_sub(mp_int *a,mp_int *b,mp_int *c)

{
  mp_digit *pmVar1;
  bool bVar2;
  int iVar3;
  mp_digit *pmVar4;
  ulong uVar5;
  mp_digit *pmVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  uint size;
  
  iVar10 = b->used;
  size = a->used;
  if ((c->alloc < (int)size) && (iVar3 = mp_grow(c,size), iVar3 != 0)) {
    return iVar3;
  }
  iVar3 = c->used;
  c->used = size;
  pmVar4 = a->dp;
  pmVar1 = c->dp;
  if (iVar10 < 1) {
    lVar9 = 0;
    iVar10 = 0;
    pmVar6 = pmVar1;
  }
  else {
    pmVar6 = b->dp;
    lVar7 = 0;
    lVar8 = 0;
    lVar9 = 0;
    do {
      uVar5 = (lVar9 + pmVar4[lVar8]) - pmVar6[lVar8];
      lVar9 = (long)uVar5 >> 0x3f;
      pmVar1[lVar8] = uVar5 & 0xfffffffffffffff;
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + -8;
    } while (iVar10 != (int)lVar8);
    pmVar4 = (mp_digit *)((long)pmVar4 - lVar7);
    pmVar6 = (mp_digit *)((long)pmVar1 - lVar7);
  }
  if (iVar10 < (int)size) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      uVar5 = lVar9 + pmVar4[lVar8];
      lVar9 = (long)uVar5 >> 0x3f;
      pmVar6[lVar8] = uVar5 & 0xfffffffffffffff;
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + -8;
    } while (size - iVar10 != (int)lVar8);
    pmVar6 = (mp_digit *)((long)pmVar6 - lVar7);
  }
  if ((int)size < iVar3) {
    memset(pmVar6,0,(ulong)(iVar3 + ~size) * 8 + 8);
  }
  if (0 < (int)size) {
    do {
      if (pmVar1[(ulong)size - 1] != 0) goto LAB_001049cc;
      c->used = size - 1;
      bVar2 = 1 < (int)size;
      size = size - 1;
    } while (bVar2);
    size = 0;
  }
LAB_001049cc:
  if (size == 0) {
    c->sign = 0;
  }
  return 0;
}

Assistant:

int s_mp_sub (mp_int * a, mp_int * b, mp_int * c)
{
  int     olduse, res, min, max;

  /* find sizes */
  min = b->used;
  max = a->used;

  /* init result */
  if (c->alloc < max) {
    if ((res = mp_grow (c, max)) != MP_OKAY) {
      return res;
    }
  }
  olduse = c->used;
  c->used = max;

  {
    register mp_digit u, *tmpa, *tmpb, *tmpc;
    register int i;

    /* alias for digit pointers */
    tmpa = a->dp;
    tmpb = b->dp;
    tmpc = c->dp;

    /* set carry to zero */
    u = 0;
    for (i = 0; i < min; i++) {
      /* T[i] = A[i] - B[i] - U */
      *tmpc = *tmpa++ - *tmpb++ - u;

      /* U = carry bit of T[i]
       * Note this saves performing an AND operation since
       * if a carry does occur it will propagate all the way to the
       * MSB.  As a result a single shift is enough to get the carry
       */
      u = *tmpc >> ((mp_digit)(CHAR_BIT * sizeof (mp_digit) - 1));

      /* Clear carry from T[i] */
      *tmpc++ &= MP_MASK;
    }

    /* now copy higher words if any, e.g. if A has more digits than B  */
    for (; i < max; i++) {
      /* T[i] = A[i] - U */
      *tmpc = *tmpa++ - u;

      /* U = carry bit of T[i] */
      u = *tmpc >> ((mp_digit)(CHAR_BIT * sizeof (mp_digit) - 1));

      /* Clear carry from T[i] */
      *tmpc++ &= MP_MASK;
    }

    /* clear digits above used (since we may not have grown result above) */
    for (i = c->used; i < olduse; i++) {
      *tmpc++ = 0;
    }
  }

  mp_clamp (c);
  return MP_OKAY;
}